

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall cppcms::filters::to_title::operator()(to_title *this,ostream *out)

{
  steal_buffer<128UL> sb;
  locale alStack_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [40];
  char *local_d8;
  
  util::steal_buffer<128UL>::steal_buffer((steal_buffer<128UL> *)local_100,out);
  (*(this->obj_).to_stream_)(out,(this->obj_).ptr_);
  util::steal_buffer<128UL>::release((steal_buffer<128UL> *)local_100);
  std::locale::locale(alStack_128,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  booster::locale::to_title<char>(&local_120,(char *)local_100._32_8_,local_d8,alStack_128);
  std::operator<<(out,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::locale::~locale(alStack_128);
  util::steal_buffer<128UL>::~steal_buffer((steal_buffer<128UL> *)local_100);
  return;
}

Assistant:

void to_title::operator()(std::ostream &out) const
	{
		util::steal_buffer<> sb(out);
		obj_(out);
		sb.release();
		out << ::cppcms::locale::to_title( sb.begin(),sb.end(),out.getloc());
	}